

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int ExpandMatrix(VP8Matrix *m,int type)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint16_t uVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    bVar1 = kBiasMatrices[(uint)type][lVar6 == 1];
    uVar2 = 0x20000 / (ulong)m->q[lVar6];
    m->iq[lVar6] = (uint16_t)uVar2;
    uVar4 = (uint)bVar1 << 9;
    m->bias[lVar6] = uVar4;
    m->zthresh[lVar6] = (uint32_t)((ulong)(uVar4 ^ 0x1ffff) / (uVar2 & 0xffff));
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  lVar6 = 0x12;
  do {
    m->q[lVar6 + -0x10] = m->q[1];
    m->q[lVar6] = m->iq[1];
    *(uint32_t *)(m->q + lVar6 * 2) = m->bias[1];
    m->bias[lVar6] = m->zthresh[1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  lVar6 = 0;
  iVar3 = 0;
  do {
    if (type == 0) {
      uVar5 = (uint16_t)((uint)m->q[lVar6] * (uint)""[lVar6] >> 0xb);
    }
    else {
      uVar5 = 0;
    }
    m->sharpen[lVar6] = uVar5;
    iVar3 = iVar3 + (uint)m->q[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  return iVar3 + 8U >> 4;
}

Assistant:

static int ExpandMatrix(VP8Matrix* const m, int type) {
  int i, sum;
  for (i = 0; i < 2; ++i) {
    const int is_ac_coeff = (i > 0);
    const int bias = kBiasMatrices[type][is_ac_coeff];
    m->iq[i] = (1 << QFIX) / m->q[i];
    m->bias[i] = BIAS(bias);
    // zthresh is the exact value such that QUANTDIV(coeff, iQ, B) is:
    //   * zero if coeff <= zthresh
    //   * non-zero if coeff > zthresh
    m->zthresh[i] = ((1 << QFIX) - 1 - m->bias[i]) / m->iq[i];
  }
  for (i = 2; i < 16; ++i) {
    m->q[i] = m->q[1];
    m->iq[i] = m->iq[1];
    m->bias[i] = m->bias[1];
    m->zthresh[i] = m->zthresh[1];
  }
  for (sum = 0, i = 0; i < 16; ++i) {
    if (type == 0) {  // we only use sharpening for AC luma coeffs
      m->sharpen[i] = (kFreqSharpening[i] * m->q[i]) >> SHARPEN_BITS;
    } else {
      m->sharpen[i] = 0;
    }
    sum += m->q[i];
  }
  return (sum + 8) >> 4;
}